

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

slice_instructions *
llava_uhd::get_slice_instructions
          (slice_instructions *__return_storage_ptr__,clip_ctx *ctx,clip_image_size *original_size)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  clip_image_size cVar4;
  ulong uVar5;
  int x;
  int iVar6;
  int iVar7;
  int iVar8;
  int jc;
  int iVar9;
  int iVar10;
  int iVar11;
  int y;
  int iVar12;
  float fVar13;
  float log_ratio;
  float fVar14;
  slice_coordinates slice;
  clip_image_size best_grid;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->slices).
           super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->slices).
           super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__return_storage_ptr__->slices).
  super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->slices).
  super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = (ctx->vision_model).hparams.image_size;
  if ((ctx->has_minicpmv_projector == true) && (ctx->minicpmv_version != 0)) {
    iVar2 = 9;
  }
  else {
    iVar2 = 0;
  }
  iVar12 = (ctx->vision_model).hparams.patch_size;
  fVar13 = (float)(*original_size).width;
  fVar14 = (float)(*original_size).height;
  log_ratio = logf(fVar13 / fVar14);
  fVar13 = ceilf((fVar14 * fVar13) / (float)(iVar3 * iVar3));
  if ((ctx->vision_model).hparams.image_grid_pinpoints.super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (ctx->vision_model).hparams.image_grid_pinpoints.super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((float)iVar2 <= fVar13) {
      fVar13 = (float)iVar2;
    }
    iVar11 = (int)fVar13;
    cVar4 = get_best_resize(original_size,iVar3,iVar12,1 < iVar11);
    __return_storage_ptr__->overview_size = cVar4;
    if (iVar11 < 2) {
      (__return_storage_ptr__->refined_size).width = 0;
      (__return_storage_ptr__->refined_size).height = 0;
      (__return_storage_ptr__->grid_size).width = 0;
      (__return_storage_ptr__->grid_size).height = 0;
    }
    else {
      best_grid = get_best_grid(iVar2,iVar11,log_ratio);
      cVar4 = get_refine_size(original_size,&best_grid,iVar3,iVar12,true);
      __return_storage_ptr__->grid_size = best_grid;
      iVar9 = cVar4.width;
      (__return_storage_ptr__->refined_size).width = iVar9;
      iVar11 = cVar4.height;
      (__return_storage_ptr__->refined_size).height = iVar11;
      iVar2 = best_grid.width;
      uVar5 = (ulong)best_grid >> 0x20;
      iVar12 = best_grid.height;
      iVar6 = 0;
      for (iVar3 = 0; (iVar6 < iVar11 && (iVar3 < (int)uVar5)); iVar3 = iVar3 + 1) {
        iVar7 = 0;
        for (iVar10 = 0;
            (slice.size.height =
                  (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | (ulong)cVar4 >> 0x20) /
                       (long)iVar12), iVar7 < iVar9 && (iVar10 < best_grid.width));
            iVar10 = iVar10 + 1) {
          iVar8 = (int)((long)((ulong)(uint)(iVar9 >> 0x1f) << 0x20 | (ulong)cVar4 & 0xffffffff) /
                       (long)iVar2);
          slice.x = iVar7;
          slice.y = iVar6;
          slice.size.width = iVar8;
          std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>::
          push_back(&__return_storage_ptr__->slices,&slice);
          iVar7 = iVar7 + iVar8;
        }
        iVar6 = iVar6 + slice.size.height;
        uVar5 = (ulong)best_grid >> 0x20;
      }
    }
  }
  else {
    cVar4 = select_best_resolution(&(ctx->vision_model).hparams.image_grid_pinpoints,original_size);
    (__return_storage_ptr__->overview_size).width = iVar3;
    (__return_storage_ptr__->overview_size).height = iVar3;
    (__return_storage_ptr__->refined_size).width = cVar4.width;
    iVar2 = cVar4.height;
    (__return_storage_ptr__->refined_size).height = iVar2;
    (__return_storage_ptr__->grid_size).width = 0;
    (__return_storage_ptr__->grid_size).height = 0;
    __return_storage_ptr__->padding_refined = true;
    for (iVar12 = 0; iVar11 = iVar2 - iVar12, iVar11 != 0 && iVar12 <= iVar2;
        iVar12 = iVar12 + iVar3) {
      if (iVar3 <= iVar11) {
        iVar11 = iVar3;
      }
      uVar5 = (ulong)cVar4 & 0xffffffff;
      for (iVar6 = 0; iVar6 < cVar4.width; iVar6 = iVar6 + iVar3) {
        iVar9 = (int)uVar5;
        slice.size.width = iVar9;
        if (iVar3 <= iVar9) {
          slice.size.width = iVar3;
        }
        slice.x = iVar6;
        slice.y = iVar12;
        slice.size.height = iVar11;
        std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>::
        push_back(&__return_storage_ptr__->slices,&slice);
        if (iVar6 == 0) {
          (__return_storage_ptr__->grid_size).width = (__return_storage_ptr__->grid_size).width + 1;
        }
        uVar5 = (ulong)(uint)(iVar9 - iVar3);
      }
      piVar1 = &(__return_storage_ptr__->grid_size).height;
      *piVar1 = *piVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static slice_instructions get_slice_instructions(struct clip_ctx * ctx, const clip_image_size & original_size) {
        slice_instructions res;
        const int patch_size      = clip_get_patch_size(ctx);
        const int slice_size      = clip_get_image_size(ctx);
        const int max_slice_nums  = get_max_slices(ctx);
        const int original_width  = original_size.width;
        const int original_height = original_size.height;
        const float log_ratio = log((float)original_width / original_height);
        const float ratio = (float)original_width * original_height / (slice_size * slice_size);
        const int multiple = fmin(ceil(ratio), max_slice_nums);
        const bool has_slices = (multiple > 1);
        const bool has_pinpoints = !ctx->vision_model.hparams.image_grid_pinpoints.empty();

        if (has_pinpoints) {
            // has pinpoints, use them to calculate the grid size (e.g. llava-1.6)
            auto refine_size = llava_uhd::select_best_resolution(
                ctx->vision_model.hparams.image_grid_pinpoints,
                original_size);
            res.overview_size   = clip_image_size{slice_size, slice_size};
            res.refined_size    = refine_size;
            res.grid_size       = clip_image_size{0, 0};
            res.padding_refined = true;

            for (int y = 0; y < refine_size.height; y += slice_size) {
                for (int x = 0; x < refine_size.width; x += slice_size) {
                    slice_coordinates slice;
                    slice.x = x;
                    slice.y = y;
                    slice.size.width  = std::min(slice_size, refine_size.width  - x);
                    slice.size.height = std::min(slice_size, refine_size.height - y);
                    res.slices.push_back(slice);
                    if (x == 0) {
                        res.grid_size.width++;
                    }
                }
                res.grid_size.height++;
            }

            return res;
        }

        // no pinpoints, dynamically calculate the grid size (e.g. minicpmv)

        auto best_size    = get_best_resize(original_size, slice_size, patch_size, has_slices);
        res.overview_size = best_size;

        if (!has_slices) {
            // skip slicing logic
            res.refined_size = clip_image_size{0, 0};
            res.grid_size    = clip_image_size{0, 0};

        } else {
            auto best_grid   = get_best_grid(max_slice_nums, multiple, log_ratio);
            auto refine_size = get_refine_size(original_size, best_grid, slice_size, patch_size, true);
            res.grid_size    = best_grid;
            res.refined_size = refine_size;

            int width  = refine_size.width;
            int height = refine_size.height;
            int grid_x = int(width  / best_grid.width);
            int grid_y = int(height / best_grid.height);
            for (int patches_y = 0,                    ic = 0;
                    patches_y < refine_size.height && ic < best_grid.height;
                    patches_y += grid_y,              ic += 1) {
                for (int patches_x = 0,                   jc = 0;
                        patches_x < refine_size.width && jc < best_grid.width;
                        patches_x += grid_x,             jc += 1) {
                    slice_coordinates slice;
                    slice.x = patches_x;
                    slice.y = patches_y;
                    slice.size.width  = grid_x;
                    slice.size.height = grid_y;
                    res.slices.push_back(slice);
                    // LOG_INF("slice %d: %d %d %d %d\n", ic, patches_i, patches_j, grid_x, grid_y);
                }
            }
        }

        return res;
    }